

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O0

bool __thiscall
cmCursesBoolWidget::HandleInput
          (cmCursesBoolWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  bool bVar1;
  int local_44;
  WINDOW *w_local;
  cmCursesMainForm *param_2_local;
  int *key_local;
  cmCursesBoolWidget *this_local;
  
  if ((*key == 10) || (*key == 0x157)) {
    bVar1 = GetValueAsBool(this);
    if (bVar1) {
      SetValueAsBool(this,false);
    }
    else {
      SetValueAsBool(this,true);
    }
    if (w == (WINDOW *)0x0) {
      local_44 = -1;
    }
    else {
      local_44 = w->_maxy + 1;
    }
    wtouchln(w,0,local_44,1);
    wrefresh(w);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCursesBoolWidget::HandleInput(int& key, cmCursesMainForm*, WINDOW* w)
{

  // 10 == enter
  if (key == 10 || key == KEY_ENTER)
    {
    if (this->GetValueAsBool())
      {
      this->SetValueAsBool(false);
      }
    else
      {
      this->SetValueAsBool(true);
      }

    touchwin(w);
    wrefresh(w);
    return true;
    }
  else
    {
    return false;
    }

}